

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O0

bool __thiscall
cmStandardLevelResolver::CompileFeatureKnown
          (cmStandardLevelResolver *this,string *targetName,string *feature,string *lang,
          string *error)

{
  cmMakefile *this_00;
  size_type sVar1;
  char **ppcVar2;
  char **ppcVar3;
  ostream *poVar4;
  bool bVar5;
  string local_318;
  string local_2f8 [32];
  undefined1 local_2d8 [8];
  ostringstream e;
  string local_160;
  cmStrCmp local_140;
  undefined1 local_119;
  undefined1 local_118 [7];
  bool isHIPFeature;
  cmStrCmp local_f8;
  undefined1 local_d1;
  undefined1 local_d0 [7];
  bool isCudaFeature;
  cmStrCmp local_b0;
  undefined1 local_8d;
  bool isCxxFeature;
  string local_80;
  cmStrCmp local_60;
  undefined1 local_39;
  string *psStack_38;
  bool isCFeature;
  string *error_local;
  string *lang_local;
  string *feature_local;
  string *targetName_local;
  cmStandardLevelResolver *this_local;
  
  psStack_38 = error;
  error_local = lang;
  lang_local = feature;
  feature_local = targetName;
  targetName_local = (string *)this;
  sVar1 = cmGeneratorExpression::Find(feature);
  if (sVar1 == 0xffffffffffffffff) {
    ppcVar2 = std::cbegin<char_const*[10]>((char *(*) [10])(anonymous_namespace)::C_FEATURES);
    ppcVar3 = std::cend<char_const*[10]>((char *(*) [10])(anonymous_namespace)::C_FEATURES);
    std::__cxx11::string::string((string *)&local_80,(string *)lang_local);
    cmStrCmp::cmStrCmp(&local_60,&local_80);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2 + 1,ppcVar3,&local_60);
    ppcVar3 = std::cend<char_const*[10]>((char *(*) [10])(anonymous_namespace)::C_FEATURES);
    bVar5 = ppcVar2 != ppcVar3;
    cmStrCmp::~cmStrCmp(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    local_39 = bVar5;
    if (bVar5) {
      std::__cxx11::string::operator=((string *)error_local,"C");
      this_local._7_1_ = 1;
    }
    else {
      ppcVar2 = std::cbegin<char_const*[65]>((char *(*) [65])(anonymous_namespace)::CXX_FEATURES);
      ppcVar3 = std::cend<char_const*[65]>((char *(*) [65])(anonymous_namespace)::CXX_FEATURES);
      std::__cxx11::string::string((string *)local_d0,(string *)lang_local);
      cmStrCmp::cmStrCmp(&local_b0,(string *)local_d0);
      ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2 + 1,ppcVar3,&local_b0);
      ppcVar3 = std::cend<char_const*[65]>((char *(*) [65])(anonymous_namespace)::CXX_FEATURES);
      bVar5 = ppcVar2 != ppcVar3;
      cmStrCmp::~cmStrCmp(&local_b0);
      std::__cxx11::string::~string((string *)local_d0);
      local_8d = bVar5;
      if (bVar5) {
        std::__cxx11::string::operator=((string *)error_local,"CXX");
        this_local._7_1_ = 1;
      }
      else {
        ppcVar2 = std::cbegin<char_const*[8]>((char *(*) [8])(anonymous_namespace)::CUDA_FEATURES);
        ppcVar3 = std::cend<char_const*[8]>((char *(*) [8])(anonymous_namespace)::CUDA_FEATURES);
        std::__cxx11::string::string((string *)local_118,(string *)lang_local);
        cmStrCmp::cmStrCmp(&local_f8,(string *)local_118);
        ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2 + 1,ppcVar3,&local_f8);
        ppcVar3 = std::cend<char_const*[8]>((char *(*) [8])(anonymous_namespace)::CUDA_FEATURES);
        bVar5 = ppcVar2 != ppcVar3;
        cmStrCmp::~cmStrCmp(&local_f8);
        std::__cxx11::string::~string((string *)local_118);
        local_d1 = bVar5;
        if (bVar5) {
          std::__cxx11::string::operator=((string *)error_local,"CUDA");
          this_local._7_1_ = 1;
        }
        else {
          ppcVar2 = std::cbegin<char_const*[8]>((char *(*) [8])(anonymous_namespace)::HIP_FEATURES);
          ppcVar3 = std::cend<char_const*[8]>((char *(*) [8])(anonymous_namespace)::HIP_FEATURES);
          std::__cxx11::string::string((string *)&local_160,(string *)lang_local);
          cmStrCmp::cmStrCmp(&local_140,&local_160);
          ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2 + 1,ppcVar3,&local_140);
          ppcVar3 = std::cend<char_const*[8]>((char *(*) [8])(anonymous_namespace)::HIP_FEATURES);
          bVar5 = ppcVar2 != ppcVar3;
          cmStrCmp::~cmStrCmp(&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          local_119 = bVar5;
          if (bVar5) {
            std::__cxx11::string::operator=((string *)error_local,"HIP");
            this_local._7_1_ = 1;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
            if (psStack_38 == (string *)0x0) {
              std::operator<<((ostream *)local_2d8,"Specified");
            }
            else {
              std::operator<<((ostream *)local_2d8,"specified");
            }
            poVar4 = std::operator<<((ostream *)local_2d8," unknown feature \"");
            poVar4 = std::operator<<(poVar4,(string *)lang_local);
            poVar4 = std::operator<<(poVar4,"\" for target \"");
            poVar4 = std::operator<<(poVar4,(string *)feature_local);
            std::operator<<(poVar4,"\".");
            if (psStack_38 == (string *)0x0) {
              this_00 = this->Makefile;
              std::__cxx11::ostringstream::str();
              cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_318);
              std::__cxx11::string::~string((string *)&local_318);
            }
            else {
              std::__cxx11::ostringstream::str();
              std::__cxx11::string::operator=((string *)psStack_38,local_2f8);
              std::__cxx11::string::~string(local_2f8);
            }
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
          }
        }
      }
    }
    return (bool)(this_local._7_1_ & 1);
  }
  __assert_fail("cmGeneratorExpression::Find(feature) == std::string::npos",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmStandardLevelResolver.cxx"
                ,0x1f0,
                "bool cmStandardLevelResolver::CompileFeatureKnown(const std::string &, const std::string &, std::string &, std::string *) const"
               );
}

Assistant:

bool cmStandardLevelResolver::CompileFeatureKnown(
  const std::string& targetName, const std::string& feature, std::string& lang,
  std::string* error) const
{
  assert(cmGeneratorExpression::Find(feature) == std::string::npos);

  bool isCFeature =
    std::find_if(cm::cbegin(C_FEATURES) + 1, cm::cend(C_FEATURES),
                 cmStrCmp(feature)) != cm::cend(C_FEATURES);
  if (isCFeature) {
    lang = "C";
    return true;
  }
  bool isCxxFeature =
    std::find_if(cm::cbegin(CXX_FEATURES) + 1, cm::cend(CXX_FEATURES),
                 cmStrCmp(feature)) != cm::cend(CXX_FEATURES);
  if (isCxxFeature) {
    lang = "CXX";
    return true;
  }
  bool isCudaFeature =
    std::find_if(cm::cbegin(CUDA_FEATURES) + 1, cm::cend(CUDA_FEATURES),
                 cmStrCmp(feature)) != cm::cend(CUDA_FEATURES);
  if (isCudaFeature) {
    lang = "CUDA";
    return true;
  }
  bool isHIPFeature =
    std::find_if(cm::cbegin(HIP_FEATURES) + 1, cm::cend(HIP_FEATURES),
                 cmStrCmp(feature)) != cm::cend(HIP_FEATURES);
  if (isHIPFeature) {
    lang = "HIP";
    return true;
  }
  std::ostringstream e;
  if (error) {
    e << "specified";
  } else {
    e << "Specified";
  }
  e << " unknown feature \"" << feature
    << "\" for "
       "target \""
    << targetName << "\".";
  if (error) {
    *error = e.str();
  } else {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
  }
  return false;
}